

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::CatalogEntry::Copy(CatalogEntry *this,ClientContext *context)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unsupported copy type for catalog entry!","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> CatalogEntry::Copy(ClientContext &context) const {
	throw InternalException("Unsupported copy type for catalog entry!");
}